

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckboxUI.cpp
# Opt level: O0

void __thiscall nite::CheckboxUI::setFontSize(CheckboxUI *this,int size)

{
  long lVar1;
  undefined1 local_38 [8];
  string fn;
  int size_local;
  CheckboxUI *this_local;
  
  if (0 < size) {
    this->fontSize = size;
    fn.field_2._12_4_ = size;
    Font::getFilename_abi_cxx11_((string *)local_38,&this->font);
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0) {
      Font::load(&this->font,(string *)local_38,fn.field_2._12_4_,1.0);
    }
    (*(this->super_BaseUIComponent)._vptr_BaseUIComponent[6])();
    (*(this->super_BaseUIComponent)._vptr_BaseUIComponent[7])();
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void nite::CheckboxUI::setFontSize(int size){
    if(size <= 0) return;
    this->fontSize = size;
    auto fn = font.getFilename();
    if(fn.length() > 0){
        font.load(fn, size, 1.0f);
    }
    calculateSize();  
    recalculate(); 
}